

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Arg *pAVar3;
  pointer pAVar4;
  IArgFunction<Catch::ConfigData> *pIVar5;
  CommandLine<Catch::ConfigData> *in_RDI;
  undefined1 local_b8 [8];
  undefined1 local_b0 [32];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  undefined1 local_50 [32];
  
  pIVar5 = (IArgFunction<Catch::ConfigData> *)operator_new(8);
  pIVar5->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_0014f6c8;
  (in_RDI->m_boundProcessName).functionObj = pIVar5;
  (in_RDI->m_options).
  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->m_options).
  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->m_options).
  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined8 *)
   ((long)&(in_RDI->m_floatingArg)._M_t.
           super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
           _M_head_impl + 5) = 0;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->m_floatingArg)._M_t.
  super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>._M_head_impl =
       (Arg *)0x0;
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<Catch::ConfigData,std::__cxx11::string>
            (in_RDI,0x68);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-?","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  pAVar4 = (pointer)(local_b0 + 0x10);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"-h","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--help","");
  Clara::addOptName((Arg *)local_b8,&local_70);
  pAVar3 = (Arg *)(local_50 + 0x10);
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"display usage information","")
  ;
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_b8,7);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-l","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--list-tests","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"list all/matching test cases","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-t","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--list-tags","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"list all/matching tags","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-s","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--success","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"include successful tests in output","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-b","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--break","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"break into debugger on failure","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-e","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--nothrow","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"skip exception tests","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-i","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--invisibles","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"show invisibles (tabs, newlines)","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-o","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--out","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"output filename","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"filename","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)local_b8,0x28,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-r","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--reporter","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"reporter to use (defaults to console)","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"name","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_b8,addReporterName,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-n","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--name","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"suite name","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"name","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)local_b8,0x48,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-a","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--abort","");
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"abort at first failure","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,abortAfterFirst);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-x","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--abortx","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"abort after x failures","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"no. failures","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
            ((ArgBuilder *)local_b8,abortAfterX,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-w","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--warn","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"enable warnings","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"warning name","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_b8,addWarning,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_70._M_dataplus._M_p = (pointer)Clara::CommandLine<Catch::ConfigData>::operator[]();
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"which test or tests to use","");
  std::__cxx11::string::_M_assign((string *)(local_70._M_dataplus._M_p + 8));
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"test name, pattern or tags","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&local_70,addTestOrTags,(string *)(local_b8 + 8));
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-d","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--durations","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"show test durations","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"yes|no","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
            ((ArgBuilder *)local_b8,setShowDurations,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-f","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b8,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--input-file","");
  Clara::addOptName((Arg *)local_b8,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"load test names to run from a file","");
  std::__cxx11::string::_M_assign((string *)((long)local_b8 + 8));
  local_50._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"filename","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_b8,loadTestNamesFromFile,(string *)local_50);
  if ((Arg *)local_50._0_8_ != pAVar3) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-#","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"--filenames-as-tags","")
  ;
  Clara::addOptName((Arg *)local_50._0_8_,(string *)(local_b8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"adds a tag for the filename","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--list-test-names-only","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_70,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"list all/matching test cases names only","");
  std::__cxx11::string::_M_assign((string *)(local_70._M_dataplus._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&local_70,3);
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--list-reporters","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_70,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 8),"list all reporters","");
  std::__cxx11::string::_M_assign((string *)(local_70._M_dataplus._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&local_70,2);
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--order","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"test case order (defaults to decl)","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"decl|lex|rand","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>((ArgBuilder *)local_50,setOrder,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--rng-seed","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"set a specific seed for random numbers","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'time\'|number","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>((ArgBuilder *)local_50,setRngSeed,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--force-colour","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&local_70,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"force colourised output (deprecated)","");
  std::__cxx11::string::_M_assign((string *)(local_70._M_dataplus._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&local_70,forceColour);
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--use-colour","");
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  local_b0._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"should output be colourised","");
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"yes|no","");
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>((ArgBuilder *)local_50,setUseColour,&local_70)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pointer)local_b0._0_8_ != pAVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        using namespace Clara;
        CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli["-?"]["-h"]["--help"]
            .describe( "display usage information" )
            .bind( &ConfigData::showHelp );

        cli["-l"]["--list-tests"]
            .describe( "list all/matching test cases" )
            .bind( &ConfigData::listTests );

        cli["-t"]["--list-tags"]
            .describe( "list all/matching tags" )
            .bind( &ConfigData::listTags );

        cli["-s"]["--success"]
            .describe( "include successful tests in output" )
            .bind( &ConfigData::showSuccessfulTests );

        cli["-b"]["--break"]
            .describe( "break into debugger on failure" )
            .bind( &ConfigData::shouldDebugBreak );

        cli["-e"]["--nothrow"]
            .describe( "skip exception tests" )
            .bind( &ConfigData::noThrow );

        cli["-i"]["--invisibles"]
            .describe( "show invisibles (tabs, newlines)" )
            .bind( &ConfigData::showInvisibles );

        cli["-o"]["--out"]
            .describe( "output filename" )
            .bind( &ConfigData::outputFilename, "filename" );

        cli["-r"]["--reporter"]
//            .placeholder( "name[:filename]" )
            .describe( "reporter to use (defaults to console)" )
            .bind( &addReporterName, "name" );

        cli["-n"]["--name"]
            .describe( "suite name" )
            .bind( &ConfigData::name, "name" );

        cli["-a"]["--abort"]
            .describe( "abort at first failure" )
            .bind( &abortAfterFirst );

        cli["-x"]["--abortx"]
            .describe( "abort after x failures" )
            .bind( &abortAfterX, "no. failures" );

        cli["-w"]["--warn"]
            .describe( "enable warnings" )
            .bind( &addWarning, "warning name" );

// - needs updating if reinstated
//        cli.into( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .placeholder( "level" );

        cli[_]
            .describe( "which test or tests to use" )
            .bind( &addTestOrTags, "test name, pattern or tags" );

        cli["-d"]["--durations"]
            .describe( "show test durations" )
            .bind( &setShowDurations, "yes|no" );

        cli["-f"]["--input-file"]
            .describe( "load test names to run from a file" )
            .bind( &loadTestNamesFromFile, "filename" );

        cli["-#"]["--filenames-as-tags"]
            .describe( "adds a tag for the filename" )
            .bind( &ConfigData::filenamesAsTags );

        // Less common commands which don't have a short form
        cli["--list-test-names-only"]
            .describe( "list all/matching test cases names only" )
            .bind( &ConfigData::listTestNamesOnly );

        cli["--list-reporters"]
            .describe( "list all reporters" )
            .bind( &ConfigData::listReporters );

        cli["--order"]
            .describe( "test case order (defaults to decl)" )
            .bind( &setOrder, "decl|lex|rand" );

        cli["--rng-seed"]
            .describe( "set a specific seed for random numbers" )
            .bind( &setRngSeed, "'time'|number" );

        cli["--force-colour"]
            .describe( "force colourised output (deprecated)" )
            .bind( &forceColour );

        cli["--use-colour"]
            .describe( "should output be colourised" )
            .bind( &setUseColour, "yes|no" );

        return cli;
    }